

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O0

void lexer_DeleteState(LexerState *state)

{
  LexerState *state_local;
  
  if (state == lexerStateEOL) {
    __assert_fail("state != lexerStateEOL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ISSOtm[P]rgbds/src/asm/lexer.cpp"
                  ,0x228,"lexer_DeleteState");
  }
  if ((state->isMmapped & 1U) == 0) {
    close((state->field_2).field_1.fd);
  }
  else if (((state->isFile & 1U) != 0) && (((state->field_2).field_1.buf[8] & 1U) == 0)) {
    munmap((state->field_2).field_0.ptr,(state->field_2).field_0.size);
  }
  free(state);
  return;
}

Assistant:

void lexer_DeleteState(struct LexerState *state)
{
	// A big chunk of the lexer state soundness is the file stack ("fstack").
	// Each context in the fstack has its own *unique* lexer state; thus, we always guarantee
	// that lexer states lifetimes are always properly managed, since they're handled solely
	// by the fstack... with *one* exception.
	// Assume a context is pushed on top of the fstack, and the corresponding lexer state gets
	// scheduled at EOF; `lexerStateEOL` thus becomes a (weak) ref to that lexer state...
	// It has been possible, due to a bug, that the corresponding fstack context gets popped
	// before EOL, deleting the associated state... but it would still be switched to at EOL.
	// This assertion checks that this doesn't happen again.
	// It could be argued that deleting a state that's scheduled for EOF could simply clear
	// `lexerStateEOL`, but there's currently no situation in which this should happen.
	assert(state != lexerStateEOL);

	if (!state->isMmapped)
		close(state->fd);
	else if (state->isFile && !state->isReferenced)
		munmap(state->ptr, state->size);
	free(state);
}